

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall
cmGlobalGenerator::IsExcluded
          (cmGlobalGenerator *this,cmLocalGenerator *root,cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  cmValue cVar3;
  string *psVar4;
  ostream *poVar5;
  cmLocalGenerator *gen;
  char *extraout_RDX;
  pointer pbVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  string_view value;
  string EXCLUDE_FROM_ALL;
  cmGeneratorExpressionInterpreter genexInterpreter;
  string local_288;
  cmGeneratorTarget *local_268;
  cmLocalGenerator *local_260;
  string *local_258;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  cmMakefile *local_1d0;
  pointer local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  undefined1 local_1a8 [40];
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Alloc_hider local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  ios_base local_138 [264];
  
  bVar2 = cmGeneratorTarget::IsInBuildSystem(target);
  bVar9 = true;
  if (bVar2) {
    this_00 = root->Makefile;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"EXCLUDE_FROM_ALL","");
    cVar3 = cmGeneratorTarget::GetProperty(target,&local_1f0);
    if (cVar3.Value != (string *)0x0) {
      local_258 = cVar3.Value;
      local_1d0 = this_00;
      cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_1c0,this_00,IncludeEmptyConfig);
      uVar7 = 0;
      local_1c8 = local_1c0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_1c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar9 = false;
      }
      else {
        iVar8 = 0;
        pbVar6 = local_1c0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_268 = target;
        local_260 = root;
        do {
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          pcVar1 = (pbVar6->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_210,pcVar1,pcVar1 + pbVar6->_M_string_length);
          local_230._M_string_length = 0;
          local_230.field_2._M_local_buf[0] = '\0';
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                    ((cmGeneratorExpressionInterpreter *)local_1a8,local_260,&local_210,local_268,
                     &local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,
                            CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                     local_230.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          pcVar1 = (local_258->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_250,pcVar1,pcVar1 + local_258->_M_string_length);
          psVar4 = cmGeneratorExpressionInterpreter::Evaluate
                             ((cmGeneratorExpressionInterpreter *)local_1a8,&local_250,&local_1f0);
          value._M_str = extraout_RDX;
          value._M_len = (size_t)(psVar4->_M_dataplus)._M_p;
          bVar2 = cmValue::IsOn((cmValue *)psVar4->_M_string_length,value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_p != &local_148) {
            operator_delete(local_158._M_p,local_148._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_p != &local_170) {
            operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
          }
          iVar8 = iVar8 + (uint)!bVar2;
          uVar7 = uVar7 + bVar2;
          std::
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)(local_1a8 + 0x18));
          cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_1a8);
          pbVar6 = pbVar6 + 1;
        } while (pbVar6 != local_1c8);
        bVar9 = uVar7 != 0;
        uVar7 = (uint)(iVar8 != 0);
        root = local_260;
        target = local_268;
      }
      if ((bVar9 != false) && ((char)uVar7 != '\0')) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The EXCLUDE_FROM_ALL property of target \"",0x29);
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\" varies by configuration. This is not supported by the \"",0x39);
        (*root->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_288);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_288._M_dataplus._M_p,local_288._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" generator.",0xc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(local_1d0,FATAL_ERROR,&local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1c0);
      cVar3.Value = local_258;
    }
    if (cVar3.Value == (string *)0x0) {
      gen = cmGeneratorTarget::GetLocalGenerator(target);
      bVar9 = IsExcluded((cmGlobalGenerator *)target,root,gen);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar9;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmLocalGenerator* root,
                                   const cmGeneratorTarget* target) const
{
  if (!target->IsInBuildSystem()) {
    return true;
  }
  cmMakefile* mf = root->GetMakefile();
  const std::string EXCLUDE_FROM_ALL = "EXCLUDE_FROM_ALL";
  if (cmValue exclude = target->GetProperty(EXCLUDE_FROM_ALL)) {
    // Expand the property value per configuration.
    unsigned int trueCount = 0;
    unsigned int falseCount = 0;
    const std::vector<std::string>& configs =
      mf->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
    for (const std::string& config : configs) {
      cmGeneratorExpressionInterpreter genexInterpreter(root, config, target);
      if (cmIsOn(genexInterpreter.Evaluate(*exclude, EXCLUDE_FROM_ALL))) {
        ++trueCount;
      } else {
        ++falseCount;
      }
    }

    // Check whether the genex expansion of the property agrees in all
    // configurations.
    if (trueCount > 0 && falseCount > 0) {
      std::ostringstream e;
      e << "The EXCLUDE_FROM_ALL property of target \"" << target->GetName()
        << "\" varies by configuration. This is not supported by the \""
        << root->GetGlobalGenerator()->GetName() << "\" generator.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return trueCount;
  }
  // This target is included in its directory.  Check whether the
  // directory is excluded.
  return this->IsExcluded(root, target->GetLocalGenerator());
}